

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionNode.cxx
# Opt level: O2

cmGeneratorExpressionNode * cmGeneratorExpressionNode::GetNode(string *identifier)

{
  int iVar1;
  const_iterator cVar2;
  cmGeneratorExpressionNode *pcVar3;
  long lVar4;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>_>
  __l;
  allocator_type local_da2;
  less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_da1;
  ShellPathNode *local_da0;
  CompileLanguageNode *local_d98;
  CompileLanguageAndIdNode *local_d90;
  LinkOnlyNode *local_d88;
  JoinNode *local_d80;
  InstallPrefixNode *local_d78;
  ZeroNode *local_d70;
  OneNode *local_d68;
  GenexEvalNode *local_d60;
  TargetGenexEvalNode *local_d58;
  TargetNameIfExistsNode *local_d50;
  TargetExistsNode *local_d48;
  TargetPolicyNode *local_d40;
  TargetObjectsNode *local_d38;
  TargetNameNode *local_d30;
  TargetPropertyNode *local_d28;
  CharacterNode<___> *local_d20;
  CharacterNode<_,_> *local_d18;
  CharacterNode<_>_> *local_d10;
  IfNode *local_d08;
  BoolNode *local_d00;
  MakeCIdentifierNode *local_cf8;
  UpperCaseNode *local_cf0;
  LowerCaseNode *local_ce8;
  RemoveDuplicatesNode *local_ce0;
  FilterNode *local_cd8;
  InListNode *local_cd0;
  EqualNode *local_cc8;
  StrEqualNode *local_cc0;
  TargetFilesystemArtifact<ArtifactBundleContentDirTag,_ArtifactPathTag> *local_cb8;
  TargetFilesystemArtifact<ArtifactBundleDirTag,_ArtifactPathTag> *local_cb0;
  TargetFilesystemArtifact<ArtifactPdbTag,_ArtifactDirTag> *local_ca8;
  TargetFilesystemArtifact<ArtifactSonameTag,_ArtifactDirTag> *local_ca0;
  TargetFilesystemArtifact<ArtifactLinkerTag,_ArtifactDirTag> *local_c98;
  TargetFilesystemArtifact<ArtifactNameTag,_ArtifactDirTag> *local_c90;
  TargetFilesystemArtifact<ArtifactPdbTag,_ArtifactNameTag> *local_c88;
  TargetFilesystemArtifact<ArtifactSonameTag,_ArtifactNameTag> *local_c80;
  TargetFilesystemArtifact<ArtifactLinkerTag,_ArtifactNameTag> *local_c78;
  TargetFilesystemArtifact<ArtifactNameTag,_ArtifactNameTag> *local_c70;
  TargetFileArtifact<ArtifactLinkerFileSuffixTag> *local_c68;
  TargetFileArtifact<ArtifactFileSuffixTag> *local_c60;
  TargetFileArtifact<ArtifactLinkerFilePrefixTag> *local_c58;
  TargetFileArtifact<ArtifactFilePrefixTag> *local_c50;
  TargetFileBaseNameArtifact<ArtifactPdbTag> *local_c48;
  TargetFileBaseNameArtifact<ArtifactLinkerTag> *local_c40;
  TargetFileBaseNameArtifact<ArtifactNameTag> *local_c38;
  TargetFilesystemArtifactNodeGroup<ArtifactPdbTag> *local_c30;
  TargetFilesystemArtifactNodeGroup<ArtifactSonameTag> *local_c28;
  TargetFilesystemArtifactNodeGroup<ArtifactLinkerTag> *local_c20;
  TargetFilesystemArtifactNodeGroup<ArtifactNameTag> *local_c18;
  ConfigurationTestNode *local_c10;
  ConfigurationNode *local_c08;
  CompileFeaturesNode *local_c00;
  PlatformIdNode *local_bf8;
  CompilerVersionNode *local_bf0;
  CompilerVersionNode *local_be8;
  CompilerVersionNode *local_be0;
  CompilerVersionNode *local_bd8;
  VersionNode<(cmSystemTools::CompareOp)1> *local_bd0;
  VersionNode<(cmSystemTools::CompareOp)3> *local_bc8;
  VersionNode<(cmSystemTools::CompareOp)2> *local_bc0;
  VersionNode<(cmSystemTools::CompareOp)5> *local_bb8;
  VersionNode<(cmSystemTools::CompareOp)4> *local_bb0;
  CompilerIdNode *local_ba8;
  CompilerIdNode *local_ba0;
  CompilerIdNode *local_b98;
  CompilerIdNode *local_b90;
  NotNode *local_b88;
  BooleanOpNode *local_b80;
  BooleanOpNode *local_b78;
  OneNode *local_b70;
  ZeroNode *local_b68;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_b60;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_b38;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_b10;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_ae8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_ac0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_a98;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_a70;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_a48;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_a20;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_9f8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_9d0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_9a8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_980;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_958;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_930;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_908;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_8e0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_8b8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_890;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_868;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_840;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_818;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_7f0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_7c8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_7a0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_778;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_750;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_728;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_700;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_6d8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_6b0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_688;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_660;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_638;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_610;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_5e8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_5c0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_598;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_570;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_548;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_520;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_4f8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_4d0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_4a8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_480;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_458;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_430;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_408;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_3e0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_3b8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_390;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_368;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_340;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_318;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_2f0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_2c8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_2a0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_278;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_250;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_228;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_200;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_1d8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_1b0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_188;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_160;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_138;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_110;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_e8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_c0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_98;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_70;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_48;
  
  if (GetNode(std::__cxx11::string_const&)::nodeMap_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&GetNode(std::__cxx11::string_const&)::nodeMap_abi_cxx11_);
    if (iVar1 != 0) {
      local_b68 = &zeroNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[2],_const_ZeroNode_*,_true>
                (&local_b60,(char (*) [2])0x46d87a,&local_b68);
      local_b70 = &oneNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[2],_const_OneNode_*,_true>(&local_b38,(char (*) [2])0x4591c8,&local_b70)
      ;
      local_b78 = &andNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[4],_const_BooleanOpNode_*,_true>
                (&local_b10,(char (*) [4])0x416931,&local_b78);
      local_b80 = &orNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[3],_const_BooleanOpNode_*,_true>
                (&local_ae8,(char (*) [3])0x4679f1,&local_b80);
      local_b88 = &notNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[4],_const_NotNode_*,_true>(&local_ac0,(char (*) [4])0x43b0d7,&local_b88)
      ;
      local_b90 = &cCompilerIdNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[14],_const_CompilerIdNode_*,_true>
                (&local_a98,(char (*) [14])0x42c86d,&local_b90);
      local_b98 = &cxxCompilerIdNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[16],_const_CompilerIdNode_*,_true>
                (&local_a70,(char (*) [16])0x42c857,&local_b98);
      local_ba0 = &cudaCompilerIdNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[17],_const_CompilerIdNode_*,_true>
                (&local_a48,(char (*) [17])"CUDA_COMPILER_ID",&local_ba0);
      local_ba8 = &fortranCompilerIdNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[20],_const_CompilerIdNode_*,_true>
                (&local_a20,(char (*) [20])0x42c881,&local_ba8);
      local_bb0 = &versionGreaterNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[16],_const_VersionNode<(cmSystemTools::CompareOp)4>_*,_true>
                (&local_9f8,(char (*) [16])"VERSION_GREATER",&local_bb0);
      local_bb8 = &versionGreaterEqNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[22],_const_VersionNode<(cmSystemTools::CompareOp)5>_*,_true>
                (&local_9d0,(char (*) [22])"VERSION_GREATER_EQUAL",&local_bb8);
      local_bc0 = &versionLessNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[13],_const_VersionNode<(cmSystemTools::CompareOp)2>_*,_true>
                (&local_9a8,(char (*) [13])"VERSION_LESS",&local_bc0);
      local_bc8 = &versionLessEqNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[19],_const_VersionNode<(cmSystemTools::CompareOp)3>_*,_true>
                (&local_980,(char (*) [19])"VERSION_LESS_EQUAL",&local_bc8);
      local_bd0 = &versionEqualNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[14],_const_VersionNode<(cmSystemTools::CompareOp)1>_*,_true>
                (&local_958,(char (*) [14])"VERSION_EQUAL",&local_bd0);
      local_bd8 = &cCompilerVersionNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[19],_const_CompilerVersionNode_*,_true>
                (&local_930,(char (*) [19])"C_COMPILER_VERSION",&local_bd8);
      local_be0 = &cxxCompilerVersionNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[21],_const_CompilerVersionNode_*,_true>
                (&local_908,(char (*) [21])"CXX_COMPILER_VERSION",&local_be0);
      local_be8 = &cudaCompilerVersionNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[22],_const_CompilerVersionNode_*,_true>
                (&local_8e0,(char (*) [22])"CUDA_COMPILER_VERSION",&local_be8);
      local_bf0 = &fortranCompilerVersionNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[25],_const_CompilerVersionNode_*,_true>
                (&local_8b8,(char (*) [25])"Fortran_COMPILER_VERSION",&local_bf0);
      local_bf8 = &platformIdNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[12],_PlatformIdNode_*,_true>
                (&local_890,(char (*) [12])"PLATFORM_ID",&local_bf8);
      local_c00 = &compileFeaturesNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[17],_const_CompileFeaturesNode_*,_true>
                (&local_868,(char (*) [17])0x40c859,&local_c00);
      local_c08 = &configurationNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[14],_const_ConfigurationNode_*,_true>
                (&local_840,(char (*) [14])0x40bdbd,&local_c08);
      local_c10 = &configurationTestNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[7],_const_ConfigurationTestNode_*,_true>
                (&local_818,(char (*) [7])0x41361b,&local_c10);
      local_c18 = &targetNodeGroup;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::
      pair<const_char_(&)[12],_const_TargetFilesystemArtifact<ArtifactNameTag,_ArtifactPathTag>_*,_true>
                (&local_7f0,(char (*) [12])0x426644,
                 (TargetFilesystemArtifact<ArtifactNameTag,_ArtifactPathTag> **)&local_c18);
      local_c20 = &targetLinkerNodeGroup;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::
      pair<const_char_(&)[19],_const_TargetFilesystemArtifact<ArtifactLinkerTag,_ArtifactPathTag>_*,_true>
                (&local_7c8,(char (*) [19])"TARGET_LINKER_FILE",
                 (TargetFilesystemArtifact<ArtifactLinkerTag,_ArtifactPathTag> **)&local_c20);
      local_c28 = &targetSoNameNodeGroup;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::
      pair<const_char_(&)[19],_const_TargetFilesystemArtifact<ArtifactSonameTag,_ArtifactPathTag>_*,_true>
                (&local_7a0,(char (*) [19])"TARGET_SONAME_FILE",
                 (TargetFilesystemArtifact<ArtifactSonameTag,_ArtifactPathTag> **)&local_c28);
      local_c30 = &targetPdbNodeGroup;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::
      pair<const_char_(&)[16],_const_TargetFilesystemArtifact<ArtifactPdbTag,_ArtifactPathTag>_*,_true>
                (&local_778,(char (*) [16])"TARGET_PDB_FILE",
                 (TargetFilesystemArtifact<ArtifactPdbTag,_ArtifactPathTag> **)&local_c30);
      local_c38 = &targetFileBaseNameNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[22],_const_TargetFileBaseNameArtifact<ArtifactNameTag>_*,_true>
                (&local_750,(char (*) [22])"TARGET_FILE_BASE_NAME",&local_c38);
      local_c40 = &targetLinkerFileBaseNameNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[29],_const_TargetFileBaseNameArtifact<ArtifactLinkerTag>_*,_true>
                (&local_728,(char (*) [29])"TARGET_LINKER_FILE_BASE_NAME",&local_c40);
      local_c48 = &targetPdbFileBaseNameNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[26],_const_TargetFileBaseNameArtifact<ArtifactPdbTag>_*,_true>
                (&local_700,(char (*) [26])"TARGET_PDB_FILE_BASE_NAME",&local_c48);
      local_c50 = &targetFilePrefixNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[19],_const_TargetFileArtifact<ArtifactFilePrefixTag>_*,_true>
                (&local_6d8,(char (*) [19])"TARGET_FILE_PREFIX",&local_c50);
      local_c58 = &targetLinkerFilePrefixNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[26],_const_TargetFileArtifact<ArtifactLinkerFilePrefixTag>_*,_true>
                (&local_6b0,(char (*) [26])"TARGET_LINKER_FILE_PREFIX",&local_c58);
      local_c60 = &targetFileSuffixNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[19],_const_TargetFileArtifact<ArtifactFileSuffixTag>_*,_true>
                (&local_688,(char (*) [19])"TARGET_FILE_SUFFIX",&local_c60);
      local_c68 = &targetLinkerFileSuffixNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[26],_const_TargetFileArtifact<ArtifactLinkerFileSuffixTag>_*,_true>
                (&local_660,(char (*) [26])"TARGET_LINKER_FILE_SUFFIX",&local_c68);
      local_c70 = &targetNodeGroup.FileName;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::
      pair<const_char_(&)[17],_const_TargetFilesystemArtifact<ArtifactNameTag,_ArtifactNameTag>_*,_true>
                (&local_638,(char (*) [17])"TARGET_FILE_NAME",&local_c70);
      local_c78 = &targetLinkerNodeGroup.FileName;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::
      pair<const_char_(&)[24],_const_TargetFilesystemArtifact<ArtifactLinkerTag,_ArtifactNameTag>_*,_true>
                (&local_610,(char (*) [24])"TARGET_LINKER_FILE_NAME",&local_c78);
      local_c80 = &targetSoNameNodeGroup.FileName;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::
      pair<const_char_(&)[24],_const_TargetFilesystemArtifact<ArtifactSonameTag,_ArtifactNameTag>_*,_true>
                (&local_5e8,(char (*) [24])"TARGET_SONAME_FILE_NAME",&local_c80);
      local_c88 = &targetPdbNodeGroup.FileName;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::
      pair<const_char_(&)[21],_const_TargetFilesystemArtifact<ArtifactPdbTag,_ArtifactNameTag>_*,_true>
                (&local_5c0,(char (*) [21])"TARGET_PDB_FILE_NAME",&local_c88);
      local_c90 = &targetNodeGroup.FileDir;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::
      pair<const_char_(&)[16],_const_TargetFilesystemArtifact<ArtifactNameTag,_ArtifactDirTag>_*,_true>
                (&local_598,(char (*) [16])"TARGET_FILE_DIR",&local_c90);
      local_c98 = &targetLinkerNodeGroup.FileDir;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::
      pair<const_char_(&)[23],_const_TargetFilesystemArtifact<ArtifactLinkerTag,_ArtifactDirTag>_*,_true>
                (&local_570,(char (*) [23])"TARGET_LINKER_FILE_DIR",&local_c98);
      local_ca0 = &targetSoNameNodeGroup.FileDir;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::
      pair<const_char_(&)[23],_const_TargetFilesystemArtifact<ArtifactSonameTag,_ArtifactDirTag>_*,_true>
                (&local_548,(char (*) [23])"TARGET_SONAME_FILE_DIR",&local_ca0);
      local_ca8 = &targetPdbNodeGroup.FileDir;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::
      pair<const_char_(&)[20],_const_TargetFilesystemArtifact<ArtifactPdbTag,_ArtifactDirTag>_*,_true>
                (&local_520,(char (*) [20])"TARGET_PDB_FILE_DIR",&local_ca8);
      local_cb0 = &targetBundleDirNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::
      pair<const_char_(&)[18],_const_TargetFilesystemArtifact<ArtifactBundleDirTag,_ArtifactPathTag>_*,_true>
                (&local_4f8,(char (*) [18])"TARGET_BUNDLE_DIR",&local_cb0);
      local_cb8 = &targetBundleContentDirNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::
      pair<const_char_(&)[26],_const_TargetFilesystemArtifact<ArtifactBundleContentDirTag,_ArtifactPathTag>_*,_true>
                (&local_4d0,(char (*) [26])"TARGET_BUNDLE_CONTENT_DIR",&local_cb8);
      local_cc0 = &strEqualNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[9],_const_StrEqualNode_*,_true>
                (&local_4a8,(char (*) [9])"STREQUAL",&local_cc0);
      local_cc8 = &equalNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[6],_const_EqualNode_*,_true>
                (&local_480,(char (*) [6])0x438828,&local_cc8);
      local_cd0 = &inListNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[8],_const_InListNode_*,_true>
                (&local_458,(char (*) [8])"IN_LIST",&local_cd0);
      local_cd8 = &filterNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[7],_const_FilterNode_*,_true>
                (&local_430,(char (*) [7])"FILTER",&local_cd8);
      local_ce0 = &removeDuplicatesNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[18],_const_RemoveDuplicatesNode_*,_true>
                (&local_408,(char (*) [18])"REMOVE_DUPLICATES",&local_ce0);
      local_ce8 = &lowerCaseNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[11],_const_LowerCaseNode_*,_true>
                (&local_3e0,(char (*) [11])"LOWER_CASE",&local_ce8);
      local_cf0 = &upperCaseNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[11],_const_UpperCaseNode_*,_true>
                (&local_3b8,(char (*) [11])"UPPER_CASE",&local_cf0);
      local_cf8 = &makeCIdentifierNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[18],_const_MakeCIdentifierNode_*,_true>
                (&local_390,(char (*) [18])"MAKE_C_IDENTIFIER",&local_cf8);
      local_d00 = &boolNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[5],_const_BoolNode_*,_true>
                (&local_368,(char (*) [5])0x413bda,&local_d00);
      local_d08 = &ifNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[3],_const_IfNode_*,_true>(&local_340,(char (*) [3])0x427462,&local_d08);
      local_d10 = &angle_rNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[8],_const_CharacterNode<_>_>____true>
                (&local_318,(char (*) [8])"ANGLE-R",&local_d10);
      local_d18 = &commaNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[6],_const_CharacterNode<_,_>_*,_true>
                (&local_2f0,(char (*) [6])"COMMA",&local_d18);
      local_d20 = &semicolonNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[10],_const_CharacterNode<___>_*,_true>
                (&local_2c8,(char (*) [10])"SEMICOLON",&local_d20);
      local_d28 = &targetPropertyNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[16],_const_TargetPropertyNode_*,_true>
                (&local_2a0,(char (*) [16])"TARGET_PROPERTY",&local_d28);
      local_d30 = &targetNameNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[12],_const_TargetNameNode_*,_true>
                (&local_278,(char (*) [12])0x4378a7,&local_d30);
      local_d38 = &targetObjectsNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[15],_const_TargetObjectsNode_*,_true>
                (&local_250,(char (*) [15])"TARGET_OBJECTS",&local_d38);
      local_d40 = &targetPolicyNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[14],_const_TargetPolicyNode_*,_true>
                (&local_228,(char (*) [14])"TARGET_POLICY",&local_d40);
      local_d48 = &targetExistsNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[14],_const_TargetExistsNode_*,_true>
                (&local_200,(char (*) [14])"TARGET_EXISTS",&local_d48);
      local_d50 = &targetNameIfExistsNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[22],_const_TargetNameIfExistsNode_*,_true>
                (&local_1d8,(char (*) [22])"TARGET_NAME_IF_EXISTS",&local_d50);
      local_d58 = &targetGenexEvalNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[18],_const_TargetGenexEvalNode_*,_true>
                (&local_1b0,(char (*) [18])"TARGET_GENEX_EVAL",&local_d58);
      local_d60 = &genexEvalNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[11],_const_GenexEvalNode_*,_true>
                (&local_188,(char (*) [11])0x43de58,&local_d60);
      local_d68 = &buildInterfaceNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[16],_const_OneNode_*,_true>
                (&local_160,(char (*) [16])"BUILD_INTERFACE",&local_d68);
      local_d70 = &installInterfaceNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[18],_const_ZeroNode_*,_true>
                (&local_138,(char (*) [18])"INSTALL_INTERFACE",&local_d70);
      local_d78 = &installPrefixNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[15],_const_InstallPrefixNode_*,_true>
                (&local_110,(char (*) [15])0x429320,&local_d78);
      local_d80 = &joinNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[5],_const_JoinNode_*,_true>(&local_e8,(char (*) [5])"JOIN",&local_d80);
      local_d88 = &linkOnlyNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[10],_const_LinkOnlyNode_*,_true>
                (&local_c0,(char (*) [10])0x41eb19,&local_d88);
      local_d90 = &languageAndIdNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[20],_const_CompileLanguageAndIdNode_*,_true>
                (&local_98,(char (*) [20])"COMPILE_LANG_AND_ID",&local_d90);
      local_d98 = &languageNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[17],_const_CompileLanguageNode_*,_true>
                (&local_70,(char (*) [17])"COMPILE_LANGUAGE",&local_d98);
      local_da0 = &shellPathNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[11],_const_ShellPathNode_*,_true>
                (&local_48,(char (*) [11])"SHELL_PATH",&local_da0);
      __l._M_len = 0x48;
      __l._M_array = &local_b60;
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>_>_>
      ::map(&GetNode(std::__cxx11::string_const&)::nodeMap_abi_cxx11_,__l,&local_da1,&local_da2);
      lVar4 = 0xb18;
      do {
        std::__cxx11::string::~string((string *)((long)&local_b60.first._M_dataplus._M_p + lVar4));
        lVar4 = lVar4 + -0x28;
      } while (lVar4 != -0x28);
      __cxa_atexit(std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>_>_>
                   ::~map,&GetNode(std::__cxx11::string_const&)::nodeMap_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&GetNode(std::__cxx11::string_const&)::nodeMap_abi_cxx11_);
    }
  }
  cVar2 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>_>_>
          ::find(&GetNode(std::__cxx11::string_const&)::nodeMap_abi_cxx11_._M_t,identifier);
  if ((_Rb_tree_header *)cVar2._M_node ==
      &GetNode(std::__cxx11::string_const&)::nodeMap_abi_cxx11_._M_t._M_impl.super__Rb_tree_header)
  {
    pcVar3 = (cmGeneratorExpressionNode *)0x0;
  }
  else {
    pcVar3 = *(cmGeneratorExpressionNode **)(cVar2._M_node + 2);
  }
  return pcVar3;
}

Assistant:

const cmGeneratorExpressionNode* cmGeneratorExpressionNode::GetNode(
  const std::string& identifier)
{
  static std::map<std::string, cmGeneratorExpressionNode const*> const nodeMap{
    { "0", &zeroNode },
    { "1", &oneNode },
    { "AND", &andNode },
    { "OR", &orNode },
    { "NOT", &notNode },
    { "C_COMPILER_ID", &cCompilerIdNode },
    { "CXX_COMPILER_ID", &cxxCompilerIdNode },
    { "CUDA_COMPILER_ID", &cudaCompilerIdNode },
    { "Fortran_COMPILER_ID", &fortranCompilerIdNode },
    { "VERSION_GREATER", &versionGreaterNode },
    { "VERSION_GREATER_EQUAL", &versionGreaterEqNode },
    { "VERSION_LESS", &versionLessNode },
    { "VERSION_LESS_EQUAL", &versionLessEqNode },
    { "VERSION_EQUAL", &versionEqualNode },
    { "C_COMPILER_VERSION", &cCompilerVersionNode },
    { "CXX_COMPILER_VERSION", &cxxCompilerVersionNode },
    { "CUDA_COMPILER_VERSION", &cudaCompilerVersionNode },
    { "Fortran_COMPILER_VERSION", &fortranCompilerVersionNode },
    { "PLATFORM_ID", &platformIdNode },
    { "COMPILE_FEATURES", &compileFeaturesNode },
    { "CONFIGURATION", &configurationNode },
    { "CONFIG", &configurationTestNode },
    { "TARGET_FILE", &targetNodeGroup.File },
    { "TARGET_LINKER_FILE", &targetLinkerNodeGroup.File },
    { "TARGET_SONAME_FILE", &targetSoNameNodeGroup.File },
    { "TARGET_PDB_FILE", &targetPdbNodeGroup.File },
    { "TARGET_FILE_BASE_NAME", &targetFileBaseNameNode },
    { "TARGET_LINKER_FILE_BASE_NAME", &targetLinkerFileBaseNameNode },
    { "TARGET_PDB_FILE_BASE_NAME", &targetPdbFileBaseNameNode },
    { "TARGET_FILE_PREFIX", &targetFilePrefixNode },
    { "TARGET_LINKER_FILE_PREFIX", &targetLinkerFilePrefixNode },
    { "TARGET_FILE_SUFFIX", &targetFileSuffixNode },
    { "TARGET_LINKER_FILE_SUFFIX", &targetLinkerFileSuffixNode },
    { "TARGET_FILE_NAME", &targetNodeGroup.FileName },
    { "TARGET_LINKER_FILE_NAME", &targetLinkerNodeGroup.FileName },
    { "TARGET_SONAME_FILE_NAME", &targetSoNameNodeGroup.FileName },
    { "TARGET_PDB_FILE_NAME", &targetPdbNodeGroup.FileName },
    { "TARGET_FILE_DIR", &targetNodeGroup.FileDir },
    { "TARGET_LINKER_FILE_DIR", &targetLinkerNodeGroup.FileDir },
    { "TARGET_SONAME_FILE_DIR", &targetSoNameNodeGroup.FileDir },
    { "TARGET_PDB_FILE_DIR", &targetPdbNodeGroup.FileDir },
    { "TARGET_BUNDLE_DIR", &targetBundleDirNode },
    { "TARGET_BUNDLE_CONTENT_DIR", &targetBundleContentDirNode },
    { "STREQUAL", &strEqualNode },
    { "EQUAL", &equalNode },
    { "IN_LIST", &inListNode },
    { "FILTER", &filterNode },
    { "REMOVE_DUPLICATES", &removeDuplicatesNode },
    { "LOWER_CASE", &lowerCaseNode },
    { "UPPER_CASE", &upperCaseNode },
    { "MAKE_C_IDENTIFIER", &makeCIdentifierNode },
    { "BOOL", &boolNode },
    { "IF", &ifNode },
    { "ANGLE-R", &angle_rNode },
    { "COMMA", &commaNode },
    { "SEMICOLON", &semicolonNode },
    { "TARGET_PROPERTY", &targetPropertyNode },
    { "TARGET_NAME", &targetNameNode },
    { "TARGET_OBJECTS", &targetObjectsNode },
    { "TARGET_POLICY", &targetPolicyNode },
    { "TARGET_EXISTS", &targetExistsNode },
    { "TARGET_NAME_IF_EXISTS", &targetNameIfExistsNode },
    { "TARGET_GENEX_EVAL", &targetGenexEvalNode },
    { "GENEX_EVAL", &genexEvalNode },
    { "BUILD_INTERFACE", &buildInterfaceNode },
    { "INSTALL_INTERFACE", &installInterfaceNode },
    { "INSTALL_PREFIX", &installPrefixNode },
    { "JOIN", &joinNode },
    { "LINK_ONLY", &linkOnlyNode },
    { "COMPILE_LANG_AND_ID", &languageAndIdNode },
    { "COMPILE_LANGUAGE", &languageNode },
    { "SHELL_PATH", &shellPathNode }
  };

  {
    auto itr = nodeMap.find(identifier);
    if (itr != nodeMap.end()) {
      return itr->second;
    }
  }
  return nullptr;
}